

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::condition(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *__return_storage_ptr__,
           SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int maxiters,
           number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *tolerance)

{
  uint *puVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  ulong uVar7;
  long lVar8;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar9;
  cpp_dec_float<100U,_int,_void> *v;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  y;
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  uint local_4e8 [3];
  undefined3 uStack_4db;
  int iStack_4d8;
  bool bStack_4d4;
  undefined8 local_4d0;
  cpp_dec_float<100U,_int,_void> local_4c8;
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  uint local_448 [3];
  undefined3 uStack_43b;
  int iStack_438;
  bool bStack_434;
  undefined8 local_430;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_420;
  cpp_dec_float<100U,_int,_void> local_418;
  ulong local_3c0;
  shared_ptr<soplex::Tolerances> local_3b8;
  shared_ptr<soplex::Tolerances> local_3a8;
  cpp_dec_float<100U,_int,_void> local_398;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_340;
  cpp_dec_float<100U,_int,_void> *local_2f0;
  cpp_dec_float<100U,_int,_void> local_2e8;
  cpp_dec_float<100U,_int,_void> local_298;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_248;
  uint local_1f8 [2];
  uint auStack_1f0 [2];
  uint local_1e8 [2];
  uint auStack_1e0 [2];
  uint local_1d8 [2];
  uint auStack_1d0 [2];
  uint local_1c8 [2];
  undefined8 uStack_1c0;
  uint local_1b8 [2];
  uint auStack_1b0 [2];
  uint local_1a8 [2];
  uint auStack_1a0 [2];
  uint local_198 [2];
  uint auStack_190 [2];
  uint local_188 [2];
  undefined8 uStack_180;
  cpp_dec_float<100U,_int,_void> local_178;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  iVar6 = (this->matrix).thesize;
  uVar11 = (ulong)iVar6;
  local_398.fpclass = cpp_dec_float_finite;
  local_398.prec_elem = 0x10;
  local_398.data._M_elems[0] = 0;
  local_398.data._M_elems[1] = 0;
  local_398.data._M_elems[2] = 0;
  local_398.data._M_elems[3] = 0;
  local_398.data._M_elems[4] = 0;
  local_398.data._M_elems[5] = 0;
  local_398.data._M_elems[6] = 0;
  local_398.data._M_elems[7] = 0;
  local_398.data._M_elems[8] = 0;
  local_398.data._M_elems[9] = 0;
  local_398.data._M_elems[10] = 0;
  local_398.data._M_elems[0xb] = 0;
  local_398.data._M_elems[0xc] = 0;
  local_398.data._M_elems[0xd] = 0;
  local_398.data._M_elems._56_5_ = 0;
  local_398.data._M_elems[0xf]._1_3_ = 0;
  local_398.exp = 0;
  local_398.neg = false;
  local_88.fpclass = cpp_dec_float_finite;
  local_88.prec_elem = 0x10;
  local_88.data._M_elems[0] = 0;
  local_88.data._M_elems[1] = 0;
  local_88.data._M_elems[2] = 0;
  local_88.data._M_elems[3] = 0;
  local_88.data._M_elems[4] = 0;
  local_88.data._M_elems[5] = 0;
  local_88.data._M_elems[6] = 0;
  local_88.data._M_elems[7] = 0;
  local_88.data._M_elems[8] = 0;
  local_88.data._M_elems[9] = 0;
  local_88.data._M_elems[10] = 0;
  local_88.data._M_elems[0xb] = 0;
  local_88.data._M_elems[0xc] = 0;
  local_88.data._M_elems[0xd] = 0;
  local_88.data._M_elems._56_5_ = 0;
  local_88.data._M_elems[0xf]._1_3_ = 0;
  local_88.exp = 0;
  local_88.neg = false;
  local_4c8.fpclass = cpp_dec_float_finite;
  local_4c8.prec_elem = 0x10;
  local_4c8.data._M_elems[0] = 0;
  local_4c8.data._M_elems[1] = 0;
  local_4c8.data._M_elems[2] = 0;
  local_4c8.data._M_elems[3] = 0;
  local_4c8.data._M_elems[4] = 0;
  local_4c8.data._M_elems[5] = 0;
  local_4c8.data._M_elems[6] = 0;
  local_4c8.data._M_elems[7] = 0;
  local_4c8.data._M_elems[8] = 0;
  local_4c8.data._M_elems[9] = 0;
  local_4c8.data._M_elems[10] = 0;
  local_4c8.data._M_elems[0xb] = 0;
  local_4c8.data._M_elems[0xc] = 0;
  local_4c8.data._M_elems[0xd] = 0;
  local_4c8.data._M_elems[0xe] = 0;
  local_4c8.data._M_elems[0xf] = 0;
  local_4c8.exp = 0;
  local_4c8.neg = false;
  local_418.fpclass = cpp_dec_float_finite;
  local_418.prec_elem = 0x10;
  local_418.data._M_elems[0] = 0;
  local_418.data._M_elems[1] = 0;
  local_418.data._M_elems[2] = 0;
  local_418.data._M_elems[3] = 0;
  local_418.data._M_elems[4] = 0;
  local_418.data._M_elems[5] = 0;
  local_418.data._M_elems[6] = 0;
  local_418.data._M_elems[7] = 0;
  local_418.data._M_elems[8] = 0;
  local_418.data._M_elems[9] = 0;
  local_418.data._M_elems[10] = 0;
  local_418.data._M_elems[0xb] = 0;
  local_418.data._M_elems[0xc] = 0;
  local_418.data._M_elems[0xd] = 0;
  local_418.data._M_elems[0xe] = 0;
  local_418.data._M_elems[0xf] = 0;
  local_418.exp = 0;
  local_418.neg = false;
  if ((long)uVar11 < 1) {
    (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
    (__return_storage_ptr__->m_backend).prec_elem = 0x10;
    (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[8] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[9] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[10] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[0xb] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[0xc] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[0xd] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[0xe] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[0xf] = 0;
    *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x3d) = 0;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)__return_storage_ptr__,1.0);
  }
  else {
    local_3a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->theLP->
         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_3a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->theLP->
         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_3a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_3a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_3a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_3a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_3a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SSVectorBase(&local_340,iVar6,&local_3a8);
    if (local_3a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_3a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_3b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->theLP->
         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_3b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->theLP->
         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_3b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_3b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_3b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_3b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_3b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SSVectorBase(&local_248,iVar6,&local_3b8);
    if (local_3b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_3b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (this->thestatus < REGULAR) {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&__return_storage_ptr__->m_backend,0,(type *)0x0);
    }
    else {
      local_3c0 = uVar11;
      if (this->matrixIsSetup == false) {
        (*this->_vptr_SPxBasisBase[5])(this,&this->thedesc);
      }
      if (this->factorized == false) {
        (*this->_vptr_SPxBasisBase[0xb])(this);
      }
      uVar11 = local_3c0;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_d8,local_3c0,(type *)0x0);
      local_4d0._0_4_ = cpp_dec_float_finite;
      local_4d0._4_4_ = 0x10;
      local_518 = ZEXT816(0);
      local_508 = ZEXT816(0);
      local_4f8 = ZEXT816(0);
      local_4e8[0] = 0;
      local_4e8[1] = 0;
      stack0xfffffffffffffb20 = 0;
      uStack_4db = 0;
      iStack_4d8 = 0;
      bStack_4d4 = false;
      local_430._0_4_ = cpp_dec_float_finite;
      local_430._4_4_ = 0x10;
      local_478 = ZEXT816(0);
      local_468 = ZEXT816(0);
      local_458 = ZEXT816(0);
      local_448[0] = 0;
      local_448[1] = 0;
      stack0xfffffffffffffbc0 = 0;
      uStack_43b = 0;
      iStack_438 = 0;
      bStack_434 = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)local_478,1.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((cpp_dec_float<100U,_int,_void> *)local_518,
                 (cpp_dec_float<100U,_int,_void> *)local_478,&local_d8);
      auVar5 = local_4f8;
      auVar4 = local_508;
      auVar3 = local_518;
      local_4c8.data._M_elems[0] = local_518._0_4_;
      local_4c8.data._M_elems[1] = local_518._4_4_;
      local_4c8.data._M_elems[2] = local_518._8_4_;
      local_4c8.data._M_elems[3] = local_518._12_4_;
      local_4c8.data._M_elems[4] = local_508._0_4_;
      local_4c8.data._M_elems[5] = local_508._4_4_;
      local_4c8.data._M_elems[6] = local_508._8_4_;
      local_4c8.data._M_elems[7] = local_508._12_4_;
      local_4c8.data._M_elems[8] = local_4f8._0_4_;
      local_4c8.data._M_elems[9] = local_4f8._4_4_;
      local_4c8.data._M_elems[10] = local_4f8._8_4_;
      local_4c8.data._M_elems[0xb] = local_4f8._12_4_;
      local_4c8.data._M_elems[0xc] = local_4e8[0];
      local_4c8.data._M_elems[0xd] = local_4e8[1];
      local_4c8.data._M_elems[0xe] = (uint)stack0xfffffffffffffb20;
      local_4c8.data._M_elems[0xf] = (uint)(CONCAT35(uStack_4db,stack0xfffffffffffffb20) >> 0x20);
      local_4c8.exp = iStack_4d8;
      local_4c8.neg = bStack_4d4;
      local_4c8.fpclass = (fpclass_type)local_4d0;
      local_4c8.prec_elem = local_4d0._4_4_;
      uVar7 = 1;
      if (1 < (int)uVar11) {
        uVar7 = uVar11 & 0xffffffff;
      }
      lVar8 = 0x48;
      uVar11 = 0;
      do {
        uStack_180 = CONCAT44(local_4c8.data._M_elems[0xf],local_4c8.data._M_elems[0xe]);
        local_188[0] = local_4e8[0];
        local_188[1] = local_4e8[1];
        local_198[0] = local_4f8._0_4_;
        local_198[1] = local_4f8._4_4_;
        auStack_190[0] = local_4f8._8_4_;
        auStack_190[1] = local_4f8._12_4_;
        local_1a8[0] = local_508._0_4_;
        local_1a8[1] = local_508._4_4_;
        auStack_1a0[0] = local_508._8_4_;
        auStack_1a0[1] = local_508._12_4_;
        local_1b8[0] = local_518._0_4_;
        local_1b8[1] = local_518._4_4_;
        auStack_1b0[0] = local_518._8_4_;
        auStack_1b0[1] = local_518._12_4_;
        lVar10 = (long)local_340.super_IdxSet.num;
        local_340.super_IdxSet.num = local_340.super_IdxSet.num + 1;
        local_340.super_IdxSet.idx[lVar10] = (int)uVar11;
        puVar1 = (uint *)((long)((local_340.
                                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar8 + -0x18);
        *(undefined8 *)puVar1 = local_4e8._0_8_;
        *(undefined8 *)(puVar1 + 2) = uStack_180;
        puVar1 = (uint *)((long)((local_340.
                                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar8 + -0x28);
        *(undefined8 *)puVar1 = local_4f8._0_8_;
        *(undefined8 *)(puVar1 + 2) = local_4f8._8_8_;
        puVar1 = (uint *)((long)((local_340.
                                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar8 + -0x38);
        *(undefined8 *)puVar1 = local_508._0_8_;
        *(undefined8 *)(puVar1 + 2) = local_508._8_8_;
        puVar1 = (uint *)((long)((local_340.
                                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar8 + -0x48);
        *(undefined8 *)puVar1 = local_518._0_8_;
        *(undefined8 *)(puVar1 + 2) = local_518._8_8_;
        *(int *)((long)((local_340.
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                lVar8 + -8) = iStack_4d8;
        *(bool *)((long)((local_340.
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                 lVar8 + -4) = bStack_4d4;
        *(undefined8 *)
         ((long)((local_340.
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar8) =
             local_4d0;
        uVar11 = uVar11 + 1;
        lVar8 = lVar8 + 0x50;
      } while (uVar7 != uVar11);
      local_518 = auVar3;
      local_508 = auVar4;
      local_4f8 = auVar5;
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator=(&local_248,&local_340);
      local_420 = this;
      local_2f0 = &__return_storage_ptr__->m_backend;
      if (0 < maxiters) {
        uVar12 = 0;
        do {
          local_418.data._M_elems[0xc] = local_4c8.data._M_elems[0xc];
          local_418.data._M_elems[0xd] = local_4c8.data._M_elems[0xd];
          local_418.data._M_elems[0xe] = local_4c8.data._M_elems[0xe];
          local_418.data._M_elems[0xf] = local_4c8.data._M_elems[0xf];
          local_418.data._M_elems[8] = local_4c8.data._M_elems[8];
          local_418.data._M_elems[9] = local_4c8.data._M_elems[9];
          local_418.data._M_elems[10] = local_4c8.data._M_elems[10];
          local_418.data._M_elems[0xb] = local_4c8.data._M_elems[0xb];
          local_418.data._M_elems[4] = local_4c8.data._M_elems[4];
          local_418.data._M_elems[5] = local_4c8.data._M_elems[5];
          local_418.data._M_elems[6] = local_4c8.data._M_elems[6];
          local_418.data._M_elems[7] = local_4c8.data._M_elems[7];
          local_418.data._M_elems[0] = local_4c8.data._M_elems[0];
          local_418.data._M_elems[1] = local_4c8.data._M_elems[1];
          local_418.data._M_elems[2] = local_4c8.data._M_elems[2];
          local_418.data._M_elems[3] = local_4c8.data._M_elems[3];
          local_418.exp = local_4c8.exp;
          local_418.neg = local_4c8.neg;
          local_418.fpclass = local_4c8.fpclass;
          local_418.prec_elem = local_4c8.prec_elem;
          multBaseWith(local_420,&local_340,&local_248);
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::length((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_478,&local_248);
          auVar5 = local_458;
          auVar4 = local_468;
          auVar3 = local_478;
          local_4c8.data._M_elems[0xc] = local_448[0];
          local_4c8.data._M_elems[0xd] = local_448[1];
          local_4c8.data._M_elems[0xe] = (uint)stack0xfffffffffffffbc0;
          local_4c8.data._M_elems[0xf] =
               (uint)(CONCAT35(uStack_43b,stack0xfffffffffffffbc0) >> 0x20);
          local_4c8.data._M_elems[8] = local_458._0_4_;
          local_4c8.data._M_elems[9] = local_458._4_4_;
          local_4c8.data._M_elems[10] = local_458._8_4_;
          local_4c8.data._M_elems[0xb] = local_458._12_4_;
          local_4c8.data._M_elems[4] = local_468._0_4_;
          local_4c8.data._M_elems[5] = local_468._4_4_;
          local_4c8.data._M_elems[6] = local_468._8_4_;
          local_4c8.data._M_elems[7] = local_468._12_4_;
          local_4c8.data._M_elems[0] = local_478._0_4_;
          local_4c8.data._M_elems[1] = local_478._4_4_;
          local_4c8.data._M_elems[2] = local_478._8_4_;
          local_4c8.data._M_elems[3] = local_478._12_4_;
          local_4c8.exp = iStack_438;
          local_4c8.neg = bStack_434;
          local_4c8.fpclass = (fpclass_type)local_430;
          local_4c8.prec_elem = local_430._4_4_;
          if (2 < uVar12) {
            local_298.data._M_elems[0xf] = local_4c8.data._M_elems[0xf];
            local_298.data._M_elems[0xe] = local_4c8.data._M_elems[0xe];
            local_298.data._M_elems[0xc] = local_448[0];
            local_298.data._M_elems[0xd] = local_448[1];
            local_298.data._M_elems[8] = local_458._0_4_;
            local_298.data._M_elems[9] = local_458._4_4_;
            local_298.data._M_elems[10] = local_458._8_4_;
            local_298.data._M_elems[0xb] = local_458._12_4_;
            local_298.data._M_elems[4] = local_468._0_4_;
            local_298.data._M_elems[5] = local_468._4_4_;
            local_298.data._M_elems[6] = local_468._8_4_;
            local_298.data._M_elems[7] = local_468._12_4_;
            local_298.data._M_elems[0] = local_478._0_4_;
            local_298.data._M_elems[1] = local_478._4_4_;
            local_298.data._M_elems[2] = local_478._8_4_;
            local_298.data._M_elems[3] = local_478._12_4_;
            local_298.exp = iStack_438;
            local_298.neg = bStack_434;
            local_298.fpclass = (fpclass_type)local_430;
            local_298.prec_elem = local_430._4_4_;
            local_478 = auVar3;
            local_468 = auVar4;
            local_458 = auVar5;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&local_298,&local_418);
            local_448[0] = local_298.data._M_elems[0xc];
            local_448[1] = local_298.data._M_elems[0xd];
            stack0xfffffffffffffbc0 = local_298.data._M_elems._56_5_;
            uStack_43b = local_298.data._M_elems[0xf]._1_3_;
            local_458._8_4_ = local_298.data._M_elems[10];
            local_458._12_4_ = local_298.data._M_elems[0xb];
            local_458._0_4_ = local_298.data._M_elems[8];
            local_458._4_4_ = local_298.data._M_elems[9];
            local_468._8_4_ = local_298.data._M_elems[6];
            local_468._12_4_ = local_298.data._M_elems[7];
            local_468._0_4_ = local_298.data._M_elems[4];
            local_468._4_4_ = local_298.data._M_elems[5];
            local_478._8_4_ = local_298.data._M_elems[2];
            local_478._12_4_ = local_298.data._M_elems[3];
            local_478._0_4_ = local_298.data._M_elems[0];
            local_478._4_4_ = local_298.data._M_elems[1];
            auVar3 = local_478;
            iStack_438 = local_298.exp;
            bStack_434 = local_298.neg;
            local_430._0_4_ = local_298.fpclass;
            local_430._4_4_ = local_298.prec_elem;
            if ((local_298.neg == true) &&
               (local_478._0_4_ = local_298.data._M_elems[0],
               local_298.fpclass != cpp_dec_float_finite || local_478._0_4_ != 0)) {
              bStack_434 = false;
            }
            local_4d0._0_4_ = cpp_dec_float_finite;
            local_4d0._4_4_ = 0x10;
            local_518 = (undefined1  [16])0x0;
            local_508 = (undefined1  [16])0x0;
            local_4f8 = (undefined1  [16])0x0;
            local_4e8[0] = 0;
            local_4e8[1] = 0;
            stack0xfffffffffffffb20 = 0;
            uStack_4db = 0;
            iStack_4d8 = 0;
            bStack_4d4 = false;
            if ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_518 != tolerance) {
              local_518 = *(undefined1 (*) [16])(tolerance->m_backend).data._M_elems;
              local_508 = *(undefined1 (*) [16])((tolerance->m_backend).data._M_elems + 4);
              local_4f8 = *(undefined1 (*) [16])((tolerance->m_backend).data._M_elems + 8);
              local_4e8._0_8_ = *(undefined8 *)((tolerance->m_backend).data._M_elems + 0xc);
              uVar2 = *(undefined8 *)((tolerance->m_backend).data._M_elems + 0xe);
              stack0xfffffffffffffb20 = (undefined5)uVar2;
              uStack_4db = (undefined3)((ulong)uVar2 >> 0x28);
              iStack_4d8 = (tolerance->m_backend).exp;
              bStack_4d4 = (tolerance->m_backend).neg;
              local_4d0._0_4_ = (tolerance->m_backend).fpclass;
              local_4d0._4_4_ = (tolerance->m_backend).prec_elem;
            }
            local_478 = auVar3;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                      ((cpp_dec_float<100U,_int,_void> *)local_518,&local_4c8);
            auVar3 = local_478;
            auVar4 = local_468;
            auVar5 = local_458;
            if (((fpclass_type)local_430 != cpp_dec_float_NaN) &&
               ((fpclass_type)local_4d0 != cpp_dec_float_NaN)) {
              iVar6 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                ((cpp_dec_float<100U,_int,_void> *)local_478,
                                 (cpp_dec_float<100U,_int,_void> *)local_518);
              auVar3 = local_478;
              auVar4 = local_468;
              auVar5 = local_458;
              if (iVar6 < 0) break;
            }
          }
          local_458 = auVar5;
          local_468 = auVar4;
          local_478 = auVar3;
          multWithBase(local_420,&local_248,&local_340);
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::length((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_d8,&local_340);
          local_4d0._0_4_ = cpp_dec_float_finite;
          local_4d0._4_4_ = 0x10;
          local_518 = (undefined1  [16])0x0;
          local_508 = (undefined1  [16])0x0;
          local_4f8 = (undefined1  [16])0x0;
          local_4e8[0] = 0;
          local_4e8[1] = 0;
          stack0xfffffffffffffb20 = 0;
          uStack_4db = 0;
          iStack_4d8 = 0;
          bStack_4d4 = false;
          local_430._0_4_ = cpp_dec_float_finite;
          local_430._4_4_ = 0x10;
          local_478 = (undefined1  [16])0x0;
          local_468 = (undefined1  [16])0x0;
          local_458 = (undefined1  [16])0x0;
          local_448[0] = 0;
          local_448[1] = 0;
          stack0xfffffffffffffbc0 = 0;
          uStack_43b = 0;
          iStack_438 = 0;
          bStack_434 = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)local_478,1.0);
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    ((cpp_dec_float<100U,_int,_void> *)local_518,
                     (cpp_dec_float<100U,_int,_void> *)local_478,&local_d8);
          auVar5 = local_4f8;
          auVar4 = local_508;
          auVar3 = local_518;
          local_418.data._M_elems[0] = local_518._0_4_;
          local_418.data._M_elems[1] = local_518._4_4_;
          local_418.data._M_elems[2] = local_518._8_4_;
          local_418.data._M_elems[3] = local_518._12_4_;
          local_418.data._M_elems[4] = local_508._0_4_;
          local_418.data._M_elems[5] = local_508._4_4_;
          local_418.data._M_elems[6] = local_508._8_4_;
          local_418.data._M_elems[7] = local_508._12_4_;
          local_418.data._M_elems[8] = local_4f8._0_4_;
          local_418.data._M_elems[9] = local_4f8._4_4_;
          local_418.data._M_elems[10] = local_4f8._8_4_;
          local_418.data._M_elems[0xb] = local_4f8._12_4_;
          local_418.data._M_elems[0xc] = local_4e8[0];
          local_418.data._M_elems[0xd] = local_4e8[1];
          local_418.data._M_elems[0xe] = (uint)stack0xfffffffffffffb20;
          local_418.data._M_elems[0xf] =
               (uint)(CONCAT35(uStack_4db,stack0xfffffffffffffb20) >> 0x20);
          local_418.exp = iStack_4d8;
          local_418.neg = bStack_4d4;
          local_128.fpclass = (fpclass_type)local_4d0;
          local_128.prec_elem = local_4d0._4_4_;
          local_418.fpclass = (fpclass_type)local_4d0;
          local_418.prec_elem = local_4d0._4_4_;
          local_128.data._M_elems[0xf] = local_418.data._M_elems[0xf];
          local_128.data._M_elems[0xe] = local_418.data._M_elems[0xe];
          local_128.data._M_elems[0] = local_518._0_4_;
          local_128.data._M_elems[1] = local_518._4_4_;
          local_128.data._M_elems[2] = local_518._8_4_;
          local_128.data._M_elems[3] = local_518._12_4_;
          local_128.data._M_elems[4] = local_508._0_4_;
          local_128.data._M_elems[5] = local_508._4_4_;
          local_128.data._M_elems[6] = local_508._8_4_;
          local_128.data._M_elems[7] = local_508._12_4_;
          local_128.data._M_elems[8] = local_4f8._0_4_;
          local_128.data._M_elems[9] = local_4f8._4_4_;
          local_128.data._M_elems[10] = local_4f8._8_4_;
          local_128.data._M_elems[0xb] = local_4f8._12_4_;
          local_128.data._M_elems[0xc] = local_4e8[0];
          local_128.data._M_elems[0xd] = local_4e8[1];
          local_128.exp = iStack_4d8;
          local_128.neg = bStack_4d4;
          local_518 = auVar3;
          local_508 = auVar4;
          local_4f8 = auVar5;
          if (0 < (long)local_340.super_IdxSet.num) {
            lVar8 = (long)local_340.super_IdxSet.num + 1;
            do {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        (&local_340.
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start
                          [local_340.super_IdxSet.idx[lVar8 + -2]].m_backend,&local_128);
              lVar8 = lVar8 + -1;
            } while (1 < lVar8);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != maxiters);
      }
      local_398.data._M_elems[0xc] = local_4c8.data._M_elems[0xc];
      local_398.data._M_elems[0xd] = local_4c8.data._M_elems[0xd];
      local_398.data._M_elems._56_5_ =
           SUB85(CONCAT44(local_4c8.data._M_elems[0xf],local_4c8.data._M_elems[0xe]),0);
      local_398.data._M_elems[0xf]._1_3_ = (undefined3)(local_4c8.data._M_elems[0xf] >> 8);
      local_398.data._M_elems[8] = local_4c8.data._M_elems[8];
      local_398.data._M_elems[9] = local_4c8.data._M_elems[9];
      local_398.data._M_elems[10] = local_4c8.data._M_elems[10];
      local_398.data._M_elems[0xb] = local_4c8.data._M_elems[0xb];
      local_398.data._M_elems[4] = local_4c8.data._M_elems[4];
      local_398.data._M_elems[5] = local_4c8.data._M_elems[5];
      local_398.data._M_elems[6] = local_4c8.data._M_elems[6];
      local_398.data._M_elems[7] = local_4c8.data._M_elems[7];
      local_398.data._M_elems[0] = local_4c8.data._M_elems[0];
      local_398.data._M_elems[1] = local_4c8.data._M_elems[1];
      local_398.data._M_elems[2] = local_4c8.data._M_elems[2];
      local_398.data._M_elems[3] = local_4c8.data._M_elems[3];
      local_398.exp = local_4c8.exp;
      local_398.neg = local_4c8.neg;
      local_398.fpclass = local_4c8.fpclass;
      local_398.prec_elem = local_4c8.prec_elem;
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clear(&local_340);
      pSVar9 = local_420;
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clear(&local_248);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_d8,local_3c0,(type *)0x0);
      local_4d0._0_4_ = cpp_dec_float_finite;
      local_4d0._4_4_ = 0x10;
      local_518 = ZEXT816(0);
      local_508 = ZEXT816(0);
      local_4f8 = ZEXT816(0);
      local_4e8[0] = 0;
      local_4e8[1] = 0;
      stack0xfffffffffffffb20 = 0;
      uStack_4db = 0;
      iStack_4d8 = 0;
      bStack_4d4 = false;
      local_430._0_4_ = cpp_dec_float_finite;
      local_430._4_4_ = 0x10;
      local_478 = ZEXT816(0);
      local_468 = ZEXT816(0);
      local_458 = ZEXT816(0);
      local_448[0] = 0;
      local_448[1] = 0;
      stack0xfffffffffffffbc0 = 0;
      uStack_43b = 0;
      iStack_438 = 0;
      bStack_434 = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)local_478,1.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((cpp_dec_float<100U,_int,_void> *)local_518,
                 (cpp_dec_float<100U,_int,_void> *)local_478,&local_d8);
      auVar5 = local_4f8;
      auVar4 = local_508;
      auVar3 = local_518;
      local_4c8.data._M_elems[0] = local_518._0_4_;
      local_4c8.data._M_elems[1] = local_518._4_4_;
      local_4c8.data._M_elems[2] = local_518._8_4_;
      local_4c8.data._M_elems[3] = local_518._12_4_;
      local_4c8.data._M_elems[4] = local_508._0_4_;
      local_4c8.data._M_elems[5] = local_508._4_4_;
      local_4c8.data._M_elems[6] = local_508._8_4_;
      local_4c8.data._M_elems[7] = local_508._12_4_;
      local_4c8.data._M_elems[8] = local_4f8._0_4_;
      local_4c8.data._M_elems[9] = local_4f8._4_4_;
      local_4c8.data._M_elems[10] = local_4f8._8_4_;
      local_4c8.data._M_elems[0xb] = local_4f8._12_4_;
      local_4c8.data._M_elems[0xc] = local_4e8[0];
      local_4c8.data._M_elems[0xd] = local_4e8[1];
      local_4c8.data._M_elems[0xe] = (uint)stack0xfffffffffffffb20;
      local_4c8.data._M_elems[0xf] = (uint)(CONCAT35(uStack_4db,stack0xfffffffffffffb20) >> 0x20);
      local_4c8.exp = iStack_4d8;
      local_4c8.neg = bStack_4d4;
      local_4c8.fpclass = (fpclass_type)local_4d0;
      local_4c8.prec_elem = local_4d0._4_4_;
      uVar11 = 1;
      if (1 < (int)local_3c0) {
        uVar11 = local_3c0 & 0xffffffff;
      }
      lVar8 = 0x48;
      uVar7 = 0;
      do {
        uStack_1c0 = CONCAT44(local_4c8.data._M_elems[0xf],local_4c8.data._M_elems[0xe]);
        local_1c8[0] = local_4e8[0];
        local_1c8[1] = local_4e8[1];
        local_1d8[0] = local_4f8._0_4_;
        local_1d8[1] = local_4f8._4_4_;
        auStack_1d0[0] = local_4f8._8_4_;
        auStack_1d0[1] = local_4f8._12_4_;
        local_1e8[0] = local_508._0_4_;
        local_1e8[1] = local_508._4_4_;
        auStack_1e0[0] = local_508._8_4_;
        auStack_1e0[1] = local_508._12_4_;
        local_1f8[0] = local_518._0_4_;
        local_1f8[1] = local_518._4_4_;
        auStack_1f0[0] = local_518._8_4_;
        auStack_1f0[1] = local_518._12_4_;
        lVar10 = (long)local_340.super_IdxSet.num;
        local_340.super_IdxSet.num = local_340.super_IdxSet.num + 1;
        local_340.super_IdxSet.idx[lVar10] = (int)uVar7;
        puVar1 = (uint *)((long)((local_340.
                                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar8 + -0x18);
        *(undefined8 *)puVar1 = local_4e8._0_8_;
        *(undefined8 *)(puVar1 + 2) = uStack_1c0;
        puVar1 = (uint *)((long)((local_340.
                                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar8 + -0x28);
        *(undefined8 *)puVar1 = local_4f8._0_8_;
        *(undefined8 *)(puVar1 + 2) = local_4f8._8_8_;
        puVar1 = (uint *)((long)((local_340.
                                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar8 + -0x38);
        *(undefined8 *)puVar1 = local_508._0_8_;
        *(undefined8 *)(puVar1 + 2) = local_508._8_8_;
        puVar1 = (uint *)((long)((local_340.
                                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar8 + -0x48);
        *(undefined8 *)puVar1 = local_518._0_8_;
        *(undefined8 *)(puVar1 + 2) = local_518._8_8_;
        *(int *)((long)((local_340.
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                lVar8 + -8) = iStack_4d8;
        *(bool *)((long)((local_340.
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                 lVar8 + -4) = bStack_4d4;
        *(undefined8 *)
         ((long)((local_340.
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar8) =
             local_4d0;
        uVar7 = uVar7 + 1;
        lVar8 = lVar8 + 0x50;
      } while (uVar11 != uVar7);
      local_518 = auVar3;
      local_508 = auVar4;
      local_4f8 = auVar5;
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator=(&local_248,&local_340);
      if (0 < maxiters) {
        uVar12 = 0;
        do {
          local_418.data._M_elems[0xc] = local_4c8.data._M_elems[0xc];
          local_418.data._M_elems[0xd] = local_4c8.data._M_elems[0xd];
          local_418.data._M_elems[0xe] = local_4c8.data._M_elems[0xe];
          local_418.data._M_elems[0xf] = local_4c8.data._M_elems[0xf];
          local_418.data._M_elems[8] = local_4c8.data._M_elems[8];
          local_418.data._M_elems[9] = local_4c8.data._M_elems[9];
          local_418.data._M_elems[10] = local_4c8.data._M_elems[10];
          local_418.data._M_elems[0xb] = local_4c8.data._M_elems[0xb];
          local_418.data._M_elems[4] = local_4c8.data._M_elems[4];
          local_418.data._M_elems[5] = local_4c8.data._M_elems[5];
          local_418.data._M_elems[6] = local_4c8.data._M_elems[6];
          local_418.data._M_elems[7] = local_4c8.data._M_elems[7];
          local_418.data._M_elems[0] = local_4c8.data._M_elems[0];
          local_418.data._M_elems[1] = local_4c8.data._M_elems[1];
          local_418.data._M_elems[2] = local_4c8.data._M_elems[2];
          local_418.data._M_elems[3] = local_4c8.data._M_elems[3];
          local_418.exp = local_4c8.exp;
          local_418.neg = local_4c8.neg;
          local_418.fpclass = local_4c8.fpclass;
          local_418.prec_elem = local_4c8.prec_elem;
          (*pSVar9->factor->_vptr_SLinSolver[0xd])(pSVar9->factor,&local_340,&local_248);
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::setup(&local_340);
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::length((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_478,&local_340);
          auVar5 = local_458;
          auVar4 = local_468;
          auVar3 = local_478;
          local_4c8.data._M_elems[0xc] = local_448[0];
          local_4c8.data._M_elems[0xd] = local_448[1];
          local_4c8.data._M_elems[0xe] = (uint)stack0xfffffffffffffbc0;
          local_4c8.data._M_elems[0xf] =
               (uint)(CONCAT35(uStack_43b,stack0xfffffffffffffbc0) >> 0x20);
          local_4c8.data._M_elems[8] = local_458._0_4_;
          local_4c8.data._M_elems[9] = local_458._4_4_;
          local_4c8.data._M_elems[10] = local_458._8_4_;
          local_4c8.data._M_elems[0xb] = local_458._12_4_;
          local_4c8.data._M_elems[4] = local_468._0_4_;
          local_4c8.data._M_elems[5] = local_468._4_4_;
          local_4c8.data._M_elems[6] = local_468._8_4_;
          local_4c8.data._M_elems[7] = local_468._12_4_;
          local_4c8.data._M_elems[0] = local_478._0_4_;
          local_4c8.data._M_elems[1] = local_478._4_4_;
          local_4c8.data._M_elems[2] = local_478._8_4_;
          local_4c8.data._M_elems[3] = local_478._12_4_;
          local_4c8.exp = iStack_438;
          local_4c8.neg = bStack_434;
          local_4c8.fpclass = (fpclass_type)local_430;
          local_4c8.prec_elem = local_430._4_4_;
          if (2 < uVar12) {
            local_2e8.data._M_elems[0xf] = local_4c8.data._M_elems[0xf];
            local_2e8.data._M_elems[0xe] = local_4c8.data._M_elems[0xe];
            local_2e8.data._M_elems[0xc] = local_448[0];
            local_2e8.data._M_elems[0xd] = local_448[1];
            local_2e8.data._M_elems[8] = local_458._0_4_;
            local_2e8.data._M_elems[9] = local_458._4_4_;
            local_2e8.data._M_elems[10] = local_458._8_4_;
            local_2e8.data._M_elems[0xb] = local_458._12_4_;
            local_2e8.data._M_elems[4] = local_468._0_4_;
            local_2e8.data._M_elems[5] = local_468._4_4_;
            local_2e8.data._M_elems[6] = local_468._8_4_;
            local_2e8.data._M_elems[7] = local_468._12_4_;
            local_2e8.data._M_elems[0] = local_478._0_4_;
            local_2e8.data._M_elems[1] = local_478._4_4_;
            local_2e8.data._M_elems[2] = local_478._8_4_;
            local_2e8.data._M_elems[3] = local_478._12_4_;
            local_2e8.exp = iStack_438;
            local_2e8.neg = bStack_434;
            local_2e8.fpclass = (fpclass_type)local_430;
            local_2e8.prec_elem = local_430._4_4_;
            local_478 = auVar3;
            local_468 = auVar4;
            local_458 = auVar5;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&local_2e8,&local_418);
            pSVar9 = local_420;
            local_448[0] = local_2e8.data._M_elems[0xc];
            local_448[1] = local_2e8.data._M_elems[0xd];
            stack0xfffffffffffffbc0 = local_2e8.data._M_elems._56_5_;
            uStack_43b = local_2e8.data._M_elems[0xf]._1_3_;
            local_458._8_4_ = local_2e8.data._M_elems[10];
            local_458._12_4_ = local_2e8.data._M_elems[0xb];
            local_458._0_4_ = local_2e8.data._M_elems[8];
            local_458._4_4_ = local_2e8.data._M_elems[9];
            local_468._8_4_ = local_2e8.data._M_elems[6];
            local_468._12_4_ = local_2e8.data._M_elems[7];
            local_468._0_4_ = local_2e8.data._M_elems[4];
            local_468._4_4_ = local_2e8.data._M_elems[5];
            local_478._8_4_ = local_2e8.data._M_elems[2];
            local_478._12_4_ = local_2e8.data._M_elems[3];
            local_478._0_4_ = local_2e8.data._M_elems[0];
            local_478._4_4_ = local_2e8.data._M_elems[1];
            auVar3 = local_478;
            iStack_438 = local_2e8.exp;
            bStack_434 = local_2e8.neg;
            local_430._0_4_ = local_2e8.fpclass;
            local_430._4_4_ = local_2e8.prec_elem;
            if ((local_2e8.neg == true) &&
               (local_478._0_4_ = local_2e8.data._M_elems[0],
               local_2e8.fpclass != cpp_dec_float_finite || local_478._0_4_ != 0)) {
              bStack_434 = false;
            }
            local_4d0._0_4_ = cpp_dec_float_finite;
            local_4d0._4_4_ = 0x10;
            local_518 = (undefined1  [16])0x0;
            local_508 = (undefined1  [16])0x0;
            local_4f8 = (undefined1  [16])0x0;
            local_4e8[0] = 0;
            local_4e8[1] = 0;
            stack0xfffffffffffffb20 = 0;
            uStack_4db = 0;
            iStack_4d8 = 0;
            bStack_4d4 = false;
            if ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_518 != tolerance) {
              local_518 = *(undefined1 (*) [16])(tolerance->m_backend).data._M_elems;
              local_508 = *(undefined1 (*) [16])((tolerance->m_backend).data._M_elems + 4);
              local_4f8 = *(undefined1 (*) [16])((tolerance->m_backend).data._M_elems + 8);
              local_4e8._0_8_ = *(undefined8 *)((tolerance->m_backend).data._M_elems + 0xc);
              uVar2 = *(undefined8 *)((tolerance->m_backend).data._M_elems + 0xe);
              stack0xfffffffffffffb20 = (undefined5)uVar2;
              uStack_4db = (undefined3)((ulong)uVar2 >> 0x28);
              iStack_4d8 = (tolerance->m_backend).exp;
              bStack_4d4 = (tolerance->m_backend).neg;
              local_4d0._0_4_ = (tolerance->m_backend).fpclass;
              local_4d0._4_4_ = (tolerance->m_backend).prec_elem;
            }
            local_478 = auVar3;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                      ((cpp_dec_float<100U,_int,_void> *)local_518,&local_4c8);
            auVar3 = local_478;
            auVar4 = local_468;
            auVar5 = local_458;
            if (((fpclass_type)local_430 != cpp_dec_float_NaN) &&
               ((fpclass_type)local_4d0 != cpp_dec_float_NaN)) {
              iVar6 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                ((cpp_dec_float<100U,_int,_void> *)local_478,
                                 (cpp_dec_float<100U,_int,_void> *)local_518);
              auVar3 = local_478;
              auVar4 = local_468;
              auVar5 = local_458;
              if (iVar6 < 0) break;
            }
          }
          local_458 = auVar5;
          local_468 = auVar4;
          local_478 = auVar3;
          (*pSVar9->factor->_vptr_SLinSolver[0x15])(pSVar9->factor,&local_248,&local_340);
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::setup(&local_248);
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::length((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_d8,&local_248);
          local_4d0._0_4_ = cpp_dec_float_finite;
          local_4d0._4_4_ = 0x10;
          local_518 = (undefined1  [16])0x0;
          local_508 = (undefined1  [16])0x0;
          local_4f8 = (undefined1  [16])0x0;
          local_4e8[0] = 0;
          local_4e8[1] = 0;
          stack0xfffffffffffffb20 = 0;
          uStack_4db = 0;
          iStack_4d8 = 0;
          bStack_4d4 = false;
          local_430._0_4_ = cpp_dec_float_finite;
          local_430._4_4_ = 0x10;
          local_478 = (undefined1  [16])0x0;
          local_468 = (undefined1  [16])0x0;
          local_458 = (undefined1  [16])0x0;
          local_448[0] = 0;
          local_448[1] = 0;
          stack0xfffffffffffffbc0 = 0;
          uStack_43b = 0;
          iStack_438 = 0;
          bStack_434 = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)local_478,1.0);
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    ((cpp_dec_float<100U,_int,_void> *)local_518,
                     (cpp_dec_float<100U,_int,_void> *)local_478,&local_d8);
          auVar5 = local_4f8;
          auVar4 = local_508;
          auVar3 = local_518;
          local_418.data._M_elems[0] = local_518._0_4_;
          local_418.data._M_elems[1] = local_518._4_4_;
          local_418.data._M_elems[2] = local_518._8_4_;
          local_418.data._M_elems[3] = local_518._12_4_;
          local_418.data._M_elems[4] = local_508._0_4_;
          local_418.data._M_elems[5] = local_508._4_4_;
          local_418.data._M_elems[6] = local_508._8_4_;
          local_418.data._M_elems[7] = local_508._12_4_;
          local_418.data._M_elems[8] = local_4f8._0_4_;
          local_418.data._M_elems[9] = local_4f8._4_4_;
          local_418.data._M_elems[10] = local_4f8._8_4_;
          local_418.data._M_elems[0xb] = local_4f8._12_4_;
          local_418.data._M_elems[0xc] = local_4e8[0];
          local_418.data._M_elems[0xd] = local_4e8[1];
          local_418.data._M_elems[0xe] = (uint)stack0xfffffffffffffb20;
          local_418.data._M_elems[0xf] =
               (uint)(CONCAT35(uStack_4db,stack0xfffffffffffffb20) >> 0x20);
          local_418.exp = iStack_4d8;
          local_418.neg = bStack_4d4;
          local_178.fpclass = (fpclass_type)local_4d0;
          local_178.prec_elem = local_4d0._4_4_;
          local_418.fpclass = (fpclass_type)local_4d0;
          local_418.prec_elem = local_4d0._4_4_;
          local_178.data._M_elems[0xf] = local_418.data._M_elems[0xf];
          local_178.data._M_elems[0xe] = local_418.data._M_elems[0xe];
          local_178.data._M_elems[0] = local_518._0_4_;
          local_178.data._M_elems[1] = local_518._4_4_;
          local_178.data._M_elems[2] = local_518._8_4_;
          local_178.data._M_elems[3] = local_518._12_4_;
          local_178.data._M_elems[4] = local_508._0_4_;
          local_178.data._M_elems[5] = local_508._4_4_;
          local_178.data._M_elems[6] = local_508._8_4_;
          local_178.data._M_elems[7] = local_508._12_4_;
          local_178.data._M_elems[8] = local_4f8._0_4_;
          local_178.data._M_elems[9] = local_4f8._4_4_;
          local_178.data._M_elems[10] = local_4f8._8_4_;
          local_178.data._M_elems[0xb] = local_4f8._12_4_;
          local_178.data._M_elems[0xc] = local_4e8[0];
          local_178.data._M_elems[0xd] = local_4e8[1];
          local_178.exp = iStack_4d8;
          local_178.neg = bStack_4d4;
          local_518 = auVar3;
          local_508 = auVar4;
          local_4f8 = auVar5;
          if (0 < (long)local_248.super_IdxSet.num) {
            lVar8 = (long)local_248.super_IdxSet.num + 1;
            do {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        (&local_248.
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start
                          [local_248.super_IdxSet.idx[lVar8 + -2]].m_backend,&local_178);
              lVar8 = lVar8 + -1;
            } while (1 < lVar8);
          }
          uVar12 = uVar12 + 1;
          pSVar9 = local_420;
        } while (uVar12 != maxiters);
      }
      __return_storage_ptr__ =
           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)local_2f0;
      v = &local_88;
      local_88.data._M_elems[0xc] = local_4c8.data._M_elems[0xc];
      local_88.data._M_elems[0xd] = local_4c8.data._M_elems[0xd];
      local_88.data._M_elems._56_5_ =
           SUB85(CONCAT44(local_4c8.data._M_elems[0xf],local_4c8.data._M_elems[0xe]),0);
      local_88.data._M_elems[0xf]._1_3_ = (undefined3)(local_4c8.data._M_elems[0xf] >> 8);
      local_88.data._M_elems[8] = local_4c8.data._M_elems[8];
      local_88.data._M_elems[9] = local_4c8.data._M_elems[9];
      local_88.data._M_elems[10] = local_4c8.data._M_elems[10];
      local_88.data._M_elems[0xb] = local_4c8.data._M_elems[0xb];
      local_88.data._M_elems[4] = local_4c8.data._M_elems[4];
      local_88.data._M_elems[5] = local_4c8.data._M_elems[5];
      local_88.data._M_elems[6] = local_4c8.data._M_elems[6];
      local_88.data._M_elems[7] = local_4c8.data._M_elems[7];
      local_88.data._M_elems[0] = local_4c8.data._M_elems[0];
      local_88.data._M_elems[1] = local_4c8.data._M_elems[1];
      local_88.data._M_elems[2] = local_4c8.data._M_elems[2];
      local_88.data._M_elems[3] = local_4c8.data._M_elems[3];
      local_88.exp = local_4c8.exp;
      local_88.neg = local_4c8.neg;
      local_88.fpclass = local_4c8.fpclass;
      local_88.prec_elem = local_4c8.prec_elem;
      local_2f0->fpclass = cpp_dec_float_finite;
      local_2f0->prec_elem = 0x10;
      (local_2f0->data)._M_elems[0] = 0;
      (local_2f0->data)._M_elems[1] = 0;
      (local_2f0->data)._M_elems[2] = 0;
      (local_2f0->data)._M_elems[3] = 0;
      (local_2f0->data)._M_elems[4] = 0;
      (local_2f0->data)._M_elems[5] = 0;
      (local_2f0->data)._M_elems[6] = 0;
      (local_2f0->data)._M_elems[7] = 0;
      (local_2f0->data)._M_elems[8] = 0;
      (local_2f0->data)._M_elems[9] = 0;
      (local_2f0->data)._M_elems[10] = 0;
      (local_2f0->data)._M_elems[0xb] = 0;
      (local_2f0->data)._M_elems[0xc] = 0;
      (local_2f0->data)._M_elems[0xd] = 0;
      (local_2f0->data)._M_elems[0xe] = 0;
      (local_2f0->data)._M_elems[0xf] = 0;
      *(undefined8 *)((long)(local_2f0->data)._M_elems + 0x3d) = 0;
      if (v == local_2f0) {
        v = &local_398;
      }
      else if (&local_398 != local_2f0) {
        *(undefined8 *)((local_2f0->data)._M_elems + 0xc) = local_398.data._M_elems._48_8_;
        *(ulong *)((local_2f0->data)._M_elems + 0xe) =
             CONCAT35(local_398.data._M_elems[0xf]._1_3_,local_398.data._M_elems._56_5_);
        *(undefined8 *)((local_2f0->data)._M_elems + 8) = local_398.data._M_elems._32_8_;
        *(undefined8 *)((local_2f0->data)._M_elems + 10) = local_398.data._M_elems._40_8_;
        *(undefined8 *)((local_2f0->data)._M_elems + 4) = local_398.data._M_elems._16_8_;
        *(undefined8 *)((local_2f0->data)._M_elems + 6) = local_398.data._M_elems._24_8_;
        *(undefined8 *)(local_2f0->data)._M_elems = local_398.data._M_elems._0_8_;
        *(undefined8 *)((local_2f0->data)._M_elems + 2) = local_398.data._M_elems._8_8_;
        local_2f0->exp = local_398.exp;
        local_2f0->neg = local_398.neg;
        local_2f0->fpclass = local_398.fpclass;
        local_2f0->prec_elem = local_398.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(local_2f0,v);
    }
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~SSVectorBase(&local_248);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~SSVectorBase(&local_340);
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)&__return_storage_ptr__->m_backend;
}

Assistant:

R SPxBasisBase<R>::condition(int maxiters, R tolerance)
{
   int dimension = matrix.size();
   int miniters = 3;    // minimum number of power method iterations
   int i;
   int c;
   R norm;
   R norminv;
   R norm1;
   R norm2;

   // catch corner case of empty matrix
   if(dimension <= 0)
      return 1.0;

   SSVectorBase<R> x(dimension, theLP->tolerances());
   SSVectorBase<R> y(dimension, theLP->tolerances());

   // check whether a regular basis matrix is available
   if(status() < REGULAR)
      return 0;

   if(!matrixIsSetup)
      (const_cast<SPxBasisBase<R>*>(this))->loadDesc(thedesc);

   if(!factorized)
      factorize();

   // initialize vectors
   norm1 = 1.0 / (R) dimension;

   for(i = 0; i < dimension; i++)
   {
      // coverity[forward_null]
      x.add(i, norm1);
   }

   y = x;

   // compute norm of B
   for(c = 0; c < maxiters; ++c)
   {
      norm2 = norm1;

      // y = B*x
      multBaseWith(x, y);
      norm1 = y.length();

      // stop if converged
      if(c >= miniters && spxAbs(norm1 - norm2) < tolerance * norm1)
         break;

      // x = B^T*y and normalize
      multWithBase(y, x);
      norm2 = 1.0 / x.length();
      x *= norm2;
   }

   norm = norm1;

   // reinitialize vectors
   x.clear();
   y.clear();
   norm1 = 1.0 / (R) dimension;

   for(i = 0; i < dimension; i++)
      x.add(i, norm1);

   y = x;

   // compute norm of B^-1
   for(c = 0; c < maxiters; ++c)
   {
      norm2 = norm1;

      // x = B^-1*y
      factor->solveRight(x, y);
      x.setup();
      norm1 = x.length();

      // stop if converged
      if(c >= miniters && spxAbs(norm1 - norm2) < tolerance * norm1)
         break;

      // y = B^-T*x and normalize
      factor->solveLeft(y, x);
      y.setup();
      norm2 = 1.0 / y.length();
      y *= norm2;
   }

   norminv = norm1;

   return norm * norminv;
}